

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CSharedMemoryWaitableObject::Initialize
          (CSharedMemoryWaitableObject *this,CPalThread *pthr,CObjectAttributes *poa)

{
  PAL_ERROR PVar1;
  LPVOID pvVar2;
  CObjectType *pCVar3;
  
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x471);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (poa == (CObjectAttributes *)0x0) {
    fprintf(_stderr,"] %s %s:%d","Initialize",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x472);
    fprintf(_stderr,"Expression: NULL != poa\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    PVar1 = CSharedMemoryObject::Initialize(&this->super_CSharedMemoryObject,pthr,poa);
    if (PVar1 == 0) {
      pCVar3 = (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot;
      if (pCVar3->m_eSynchronizationSupport != WaitableObject) {
        fprintf(_stderr,"] %s %s:%d","Initialize",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0x485);
        fprintf(_stderr,
                "Expression: CObjectType::WaitableObject == m_pot->GetSynchronizationSupport()\n");
        pCVar3 = (this->super_CSharedMemoryObject).super_CPalObjectBase.m_pot;
      }
      PVar1 = (**(code **)(*g_pSynchronizationManager + 0x38))
                        (g_pSynchronizationManager,pCVar3,
                         (this->super_CSharedMemoryObject).m_ObjectDomain,&this->m_pvSynchData);
      if ((PVar1 == 0) && ((this->super_CSharedMemoryObject).m_ObjectDomain == SharedObject)) {
        pvVar2 = SHMPtrToPtr((this->super_CSharedMemoryObject).m_shmod);
        if (pvVar2 == (LPVOID)0x0) {
          fprintf(_stderr,"] %s %s:%d","Initialize",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                  ,0x490);
          fprintf(_stderr,"Expression: NULL != pshmod\n");
        }
        *(VOID **)((long)pvVar2 + 0x40) = this->m_pvSynchData;
        PVar1 = 0;
      }
    }
    if (PAL_InitializeChakraCoreCalled != false) {
      return PVar1;
    }
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryWaitableObject::Initialize(
    CPalThread *pthr,
    CObjectAttributes *poa
    )
{
    PAL_ERROR palError = NO_ERROR;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != poa);

    ENTRY("CSharedMemoryWaitableObject::Initialize"
        "(this = %p, pthr = %p, poa = %p)\n",
        this,
        pthr,
        poa
        );

    palError = CSharedMemoryObject::Initialize(pthr, poa);
    if (NO_ERROR != palError)
    {
        goto InitializeExit;
    }

    //
    // Sanity check the passed in object type
    //

    _ASSERTE(CObjectType::WaitableObject == m_pot->GetSynchronizationSupport());

    palError = g_pSynchronizationManager->AllocateObjectSynchData(
        m_pot,
        m_ObjectDomain,
        &m_pvSynchData
        );

    if (NO_ERROR == palError && SharedObject == m_ObjectDomain)
    {        
        SHMObjData *pshmod = SHMPTR_TO_TYPED_PTR(SHMObjData, m_shmod);
        _ASSERTE(NULL != pshmod);

        pshmod->pvSynchData = m_pvSynchData;
    }

InitializeExit:

    LOGEXIT("CSharedMemoryWaitableObject::Initialize returns %d\n", palError);

    return palError;
}